

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::updateButtonIcons(QCalendarWidgetPrivate *this)

{
  bool bVar1;
  QCalendarWidget *pQVar2;
  QWidget *this_00;
  QStyle *pQVar3;
  QCalendarWidgetPrivate *in_RDI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QCalendarWidget *q;
  QWidget *in_stack_ffffffffffffff98;
  QToolButton *pQVar4;
  QIcon *icon;
  QIcon local_18;
  QIcon local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  pQVar4 = in_RDI->prevMonth;
  this_00 = (QWidget *)QWidget::style(in_stack_ffffffffffffff98);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x51c34b);
  icon = &local_10;
  (**(code **)(*(long *)this_00 + 0x100))(icon,this_00,bVar1 | 0x34,0,pQVar2,in_R9,this_00,pQVar4);
  QAbstractButton::setIcon((QAbstractButton *)in_RDI,icon);
  QIcon::~QIcon(icon);
  pQVar3 = QWidget::style(this_00);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x51c3ba);
  (**(code **)(*(long *)pQVar3 + 0x100))(&local_18,pQVar3,bVar1 ^ 0x35,0,pQVar2);
  QAbstractButton::setIcon((QAbstractButton *)in_RDI,icon);
  QIcon::~QIcon(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::updateButtonIcons()
{
    Q_Q(QCalendarWidget);
    prevMonth->setIcon(q->style()->standardIcon(q->isRightToLeft() ? QStyle::SP_ArrowRight : QStyle::SP_ArrowLeft, nullptr, q));
    nextMonth->setIcon(q->style()->standardIcon(q->isRightToLeft() ? QStyle::SP_ArrowLeft : QStyle::SP_ArrowRight, nullptr, q));
}